

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcs.cc
# Opt level: O3

int __thiscall dcs::Header::readFrom(Header *this,char *buf,size_t len)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  time_t tVar6;
  runtime_error *prVar7;
  undefined8 uVar8;
  Header *pHVar9;
  int *in_R9;
  ulong uVar10;
  size_t sVar11;
  tm tm;
  undefined1 local_a8 [32];
  undefined8 local_88;
  long lStack_80;
  char *local_78;
  undefined8 local_68;
  Header *local_60;
  int local_54;
  size_t local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (len < 8) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._0_4_ = 0x37;
    util::str<char[42],char[85],char[2],int>
              ((string *)local_a8,(util *)"Assertion `(len - nread) >= 8` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
    std::runtime_error::runtime_error(prVar7,(string *)local_a8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_sscanf(buf,"%08lx",this);
  if (iVar2 != 1) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._0_4_ = 0x39;
    util::str<char[31],char[85],char[2],int>
              ((string *)local_a8,(util *)"Assertion `rv == 1` failed at ",
               (char (*) [31])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
    std::runtime_error::runtime_error(prVar7,(string *)local_a8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_60 = this;
  local_50 = len;
  if (0xfffffffffffffff4 < len - 0x13) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68._0_4_ = 0x41;
    util::str<char[42],char[85],char[2],int>
              ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
               (char (*) [42])
               "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
               ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
    std::runtime_error::runtime_error(prVar7,(string *)local_a8);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = local_a8 + 0x10;
  local_a8._8_8_ = 2;
  local_a8[0x12] = 0;
  local_a8._16_2_ = *(ushort *)(buf + 8);
  local_a8._0_8_ = pcVar1;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(pcVar1,(char **)&local_68,10);
  if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_0010b175:
    std::__throw_out_of_range("stoi");
LAB_0010b181:
    std::__throw_invalid_argument("stoi");
LAB_0010b18d:
    std::__throw_out_of_range("stoi");
LAB_0010b199:
    std::__throw_invalid_argument("stoi");
LAB_0010b1a5:
    std::__throw_out_of_range("stoi");
LAB_0010b1b1:
    std::__throw_invalid_argument("stoi");
LAB_0010b1bd:
    std::__throw_out_of_range("stoi");
LAB_0010b1c9:
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((int)lVar4 != lVar4) || (*piVar3 == 0x22)) goto LAB_0010b175;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    local_38 = lVar4;
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    pcVar1 = local_a8 + 0x10;
    local_a8._8_8_ = 3;
    local_a8[0x13] = 0;
    local_a8._16_3_ = *(uint3 *)(buf + 10);
    iVar2 = *piVar3;
    *piVar3 = 0;
    local_a8._0_8_ = pcVar1;
    lVar4 = strtol(pcVar1,(char **)&local_68,10);
    if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) goto LAB_0010b181;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0010b18d;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    pcVar1 = local_a8 + 0x10;
    local_a8._8_8_ = 2;
    local_a8[0x12] = 0;
    local_a8._16_2_ = *(ushort *)(buf + 0xd);
    iVar2 = *piVar3;
    *piVar3 = 0;
    local_a8._0_8_ = pcVar1;
    lVar5 = strtol(pcVar1,(char **)&local_68,10);
    if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) goto LAB_0010b199;
    if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0010b1a5;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    local_48 = lVar5;
    local_40 = lVar4;
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    pcVar1 = local_a8 + 0x10;
    local_a8._8_8_ = 2;
    local_a8[0x12] = 0;
    local_a8._16_2_ = *(ushort *)(buf + 0xf);
    iVar2 = *piVar3;
    *piVar3 = 0;
    local_a8._0_8_ = pcVar1;
    lVar4 = strtol(pcVar1,(char **)&local_68,10);
    if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) goto LAB_0010b1b1;
    if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0010b1bd;
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    pcVar1 = local_a8 + 0x10;
    local_a8._8_8_ = 2;
    local_a8[0x12] = 0;
    local_a8._16_2_ = *(ushort *)(buf + 0x11);
    local_54 = *piVar3;
    *piVar3 = 0;
    local_a8._0_8_ = pcVar1;
    lVar5 = strtol(pcVar1,(char **)&local_68,10);
    sVar11 = local_50;
    if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) goto LAB_0010b1c9;
    if ((0xfffffffeffffffff < lVar5 - 0x80000000U) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = local_54;
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      local_a8._24_4_ = 0;
      local_a8._28_4_ = 0;
      local_78 = (char *)0x0;
      local_88._0_4_ = 0;
      local_88._4_4_ = 0;
      lStack_80 = 0;
      local_a8._0_8_ = (char *)0x0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = (ulong)((int)local_38 + 100) << 0x20;
      tVar6 = mktime((tm *)local_a8);
      (local_60->time).tv_sec =
           lVar5 + tVar6 +
           ((long)((ulong)(uint)((int)lVar4 + (int)local_48 * 0x3c + (int)local_40 * 0x5a0) *
                  0x3c00000000) >> 0x20);
      (local_60->time).tv_nsec = 0;
      if (sVar11 == 0x13) goto LAB_0010b1e1;
      local_60->failure = buf[0x13];
      uVar10 = sVar11 & 0xfffffffffffffffe;
      if (uVar10 == 0x14) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_68._0_4_ = 99;
        util::str<char[42],char[85],char[2],int>
                  ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                   (char (*) [42])
                   "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                   ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
        std::runtime_error::runtime_error(prVar7,(string *)local_a8);
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar1 = local_a8 + 0x10;
      local_a8._8_8_ = 2;
      local_a8[0x12] = 0;
      local_a8._16_2_ = *(ushort *)(buf + 0x14);
      iVar2 = *piVar3;
      *piVar3 = 0;
      local_a8._0_8_ = pcVar1;
      lVar4 = strtol(pcVar1,(char **)&local_68,10);
      pHVar9 = local_60;
      if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) {
        std::__throw_invalid_argument("stoi");
      }
      else if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar2;
        }
        local_60->signalStrength = (int)lVar4;
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        if (uVar10 == 0x16) goto LAB_0010b2bb;
        if (((buf[0x16] == '-') || (buf[0x16] == '+')) && (buf[0x17] == 'A')) {
          pHVar9->frequencyOffset = 0;
          sVar11 = local_50;
LAB_0010ae83:
          if (sVar11 == 0x18) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_68._0_4_ = 0x78;
            util::str<char[42],char[85],char[2],int>
                      ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                       (char (*) [42])
                       "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                       ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
            std::runtime_error::runtime_error(prVar7,(string *)local_a8);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pHVar9->modulationIndex = buf[0x18];
          if (sVar11 == 0x19) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_68._0_4_ = 0x80;
            util::str<char[42],char[85],char[2],int>
                      ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                       (char (*) [42])
                       "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                       ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
            std::runtime_error::runtime_error(prVar7,(string *)local_a8);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pHVar9->dataQuality = buf[0x19];
          if (0xfffffffffffffffc < sVar11 - 0x1d) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_68._0_4_ = 0x88;
            util::str<char[42],char[85],char[2],int>
                      ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                       (char (*) [42])
                       "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                       ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
            std::runtime_error::runtime_error(prVar7,(string *)local_a8);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pcVar1 = local_a8 + 0x10;
          local_a8._8_8_ = 3;
          local_a8[0x13] = 0;
          local_a8._16_3_ = *(uint3 *)(buf + 0x1a);
          iVar2 = *piVar3;
          *piVar3 = 0;
          local_a8._0_8_ = pcVar1;
          lVar4 = strtol(pcVar1,(char **)&local_68,10);
          sVar11 = local_50;
          pHVar9 = local_60;
          if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) {
            std::__throw_invalid_argument("stoi");
          }
          else if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
            if (*piVar3 == 0) {
              *piVar3 = iVar2;
            }
            local_60->receiveChannel = (int)lVar4;
            if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
              operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
            }
            if (sVar11 == 0x1d) goto LAB_0010b457;
            pHVar9->spacecraft = buf[0x1d];
            if (uVar10 == 0x1e) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_68._0_4_ = 0x98;
              util::str<char[42],char[85],char[2],int>
                        ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                         (char (*) [42])
                         "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                         ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
              std::runtime_error::runtime_error(prVar7,(string *)local_a8);
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            *(undefined2 *)pHVar9->dataSourceCode = *(undefined2 *)(buf + 0x1e);
            if (0xfffffffffffffffa < sVar11 - 0x25) {
              prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_68._0_4_ = 0xa0;
              util::str<char[42],char[85],char[2],int>
                        ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                         (char (*) [42])
                         "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                         ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
              std::runtime_error::runtime_error(prVar7,(string *)local_a8);
              __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pcVar1 = local_a8 + 0x10;
            local_a8._8_8_ = 5;
            local_a8[0x15] = 0;
            local_a8._16_5_ = *(uint5 *)(buf + 0x20);
            iVar2 = *piVar3;
            *piVar3 = 0;
            local_a8._0_8_ = pcVar1;
            lVar4 = strtol(pcVar1,(char **)&local_68,10);
            if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) == pcVar1) {
              std::__throw_invalid_argument("stoi");
            }
            else if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
              if (*piVar3 == 0) {
                *piVar3 = iVar2;
              }
              local_60->dataLength = (int)lVar4;
              if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
                operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
              }
              return 0x25;
            }
            std::__throw_out_of_range("stoi");
            goto LAB_0010b58a;
          }
          std::__throw_out_of_range("stoi");
LAB_0010b457:
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_68._0_4_ = 0x90;
          util::str<char[42],char[85],char[2],int>
                    ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                     (char (*) [42])
                     "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                     ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
          std::runtime_error::runtime_error(prVar7,(string *)local_a8);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar1 = local_a8 + 0x10;
        local_a8._8_8_ = 2;
        local_a8[0x12] = 0;
        local_a8._16_2_ = *(ushort *)(buf + 0x16);
        iVar2 = *piVar3;
        *piVar3 = 0;
        local_a8._0_8_ = pcVar1;
        lVar4 = strtol(pcVar1,(char **)&local_68,10);
        sVar11 = local_50;
        pHVar9 = local_60;
        if ((char *)CONCAT44(local_68._4_4_,(undefined4)local_68) != pcVar1) {
          if ((lVar4 - 0x80000000U < 0xffffffff00000000) || (*piVar3 == 0x22)) goto LAB_0010b596;
          if (*piVar3 == 0) {
            *piVar3 = iVar2;
          }
          local_60->frequencyOffset = (int)lVar4;
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
          }
          goto LAB_0010ae83;
        }
LAB_0010b58a:
        std::__throw_invalid_argument("stoi");
LAB_0010b596:
        uVar8 = std::__throw_out_of_range("stoi");
        if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
        }
        if ((char)iVar2 != '\0') {
          __cxa_free_exception(&local_68);
        }
        _Unwind_Resume(uVar8);
      }
      std::__throw_out_of_range("stoi");
LAB_0010b2bb:
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_68._0_4_ = 0x6b;
      util::str<char[42],char[85],char[2],int>
                ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
                 (char (*) [42])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc"
                 ,(char (*) [85])":",(char (*) [2])&local_68,in_R9);
      std::runtime_error::runtime_error(prVar7,(string *)local_a8);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__throw_out_of_range("stoi");
LAB_0010b1e1:
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68._0_4_ = 0x5b;
  util::str<char[42],char[85],char[2],int>
            ((string *)local_a8,(util *)"Assertion `(len - nread) >= n` failed at ",
             (char (*) [42])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/dcs/dcs.cc",
             (char (*) [85])":",(char (*) [2])&local_68,in_R9);
  std::runtime_error::runtime_error(prVar7,(string *)local_a8);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int Header::readFrom(const char* buf, size_t len) {
  size_t nread = 0;

  // 8 hex digit DCP Address
  {
    constexpr unsigned n = 8;
    ASSERT((len - nread) >= 8);
    auto rv = sscanf(buf + nread, "%08lx", &address);
    ASSERT(rv == 1);
    nread += n;
  }

  // YYDDDHHMMSS – Time the message arrived at the Wallops receive station.
  // The day is represented as a three digit day of the year (julian day).
  {
    constexpr unsigned n = 11;
    ASSERT((len - nread) >= n);
    auto year = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto day = std::stoi(std::string(buf + nread, 3), nullptr, 10);
    nread += 3;
    auto hour = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto minute = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;
    auto second = std::stoi(std::string(buf + nread, 2), nullptr, 10);
    nread += 2;

    struct tm tm;
    memset(&tm, 0, sizeof(tm));

    // The number of years since 1900.
    tm.tm_year = 100 + year;

    // Use offset at beginning of year and add parts
    time.tv_sec = mktime(&tm) + ((((day * 24) + hour) * 60) + minute) * 60 + second;
    time.tv_nsec = 0;
  }

  // 1 character failure code
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    failure = buf[nread];
    nread += n;
  }

  // 2 decimal digit signal strength
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    signalStrength = std::stoi(std::string(buf + nread, 2));
    nread += n;
  }

  // 2 decimal digit frequency offset
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    // This can be +A or -A; don't know what it means...
    if ((buf[nread] == '+' || buf[nread] == '-') && buf[nread+1] == 'A') {
      frequencyOffset = 0;
    } else {
      frequencyOffset = std::stoi(std::string(buf + nread, n));
    }
    nread += n;
  }

  // 1 character modulation index
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    modulationIndex = buf[nread];
    nread += n;
  }

  // 1 character data quality indicator
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    dataQuality = buf[nread];
    nread += n;
  }

  // 3 decimal digit GOES receive channel
  {
    constexpr unsigned n = 3;
    ASSERT((len - nread) >= n);
    receiveChannel = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  // 1 character GOES spacecraft indicator ('E' or 'W')
  {
    constexpr unsigned n = 1;
    ASSERT((len - nread) >= n);
    spacecraft = buf[nread];
    nread += n;
  }

  // 2 character data source code Data Source Code Table
  {
    constexpr unsigned n = 2;
    ASSERT((len - nread) >= n);
    memcpy(dataSourceCode, buf + nread, n);
    nread += n;
  }

  // 5 decimal digit message data length
  {
    constexpr unsigned n = 5;
    ASSERT((len - nread) >= n);
    dataLength = std::stoi(std::string(buf + nread, n));
    nread += n;
  }

  return nread;
}